

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

void __thiscall LogImpl::LogImpl(LogImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ConfigSet config;
  string local_70;
  ConfigSet local_50;
  StringConverter local_40;
  
  (this->m_config).mP.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_config).mP.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::ofstream::ofstream(&this->m_ofstream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_prefix,s_prefix,(allocator<char> *)&local_70);
  cali::RuntimeConfig::get_default_config();
  cali::RuntimeConfig::init((RuntimeConfig *)&local_50,(EVP_PKEY_CTX *)&local_70);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_string_length);
  }
  cali::ConfigSet::get((StringConverter *)&local_70,&local_50,"verbosity");
  iVar2 = cali::StringConverter::to_int((StringConverter *)&local_70,(bool *)0x0);
  this->m_verbosity = iVar2;
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  cali::ConfigSet::get(&local_40,&local_50,"logfile");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_40.m_str._M_dataplus._M_p,
             local_40.m_str._M_dataplus._M_p + local_40.m_str._M_string_length);
  init_stream(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.m_str._M_dataplus._M_p != &local_40.m_str.field_2) {
    operator_delete(local_40.m_str._M_dataplus._M_p,local_40.m_str.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_50.mP.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.mP.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

LogImpl() : m_prefix { s_prefix }
    {
        ConfigSet config = RuntimeConfig::get_default_config().init("log", s_configdata);

        m_verbosity = config.get("verbosity").to_int();
        init_stream(config.get("logfile").to_string());
    }